

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-mon-list.c
# Opt level: O0

void monster_list_show_interactive(wchar_t height,wchar_t width)

{
  region_conflict orig_area;
  wchar_t max_lines;
  code *compare;
  keypress kVar1;
  wchar_t local_1b0;
  int local_1ac;
  ui_event_type local_1a0;
  char local_188 [8];
  char buf [300];
  int iStack_54;
  keypress ch;
  wchar_t sort_exp;
  region_conflict r;
  wchar_t safe_width;
  wchar_t safe_height;
  size_t max_height;
  size_t max_width;
  monster_list_t *list;
  textblock *tb;
  wchar_t width_local;
  wchar_t height_local;
  
  max_height = 0;
  _safe_width = 0;
  ch.code = 0;
  if ((L'\0' < height) && (tb._0_4_ = width, tb._4_4_ = height, L'\0' < width)) {
    do {
      list = (monster_list_t *)textblock_new();
      max_width = (size_t)monster_list_new();
      monster_list_collect((monster_list_t *)max_width);
      monster_list_get_glyphs((monster_list_t *)max_width);
      compare = monster_list_standard_compare;
      if (ch.code != 0) {
        compare = monster_list_compare_exp;
      }
      monster_list_sort((monster_list_t *)max_width,compare);
      monster_list_format_textblock
                ((monster_list_t *)max_width,(textblock *)0x0,L'Ϩ',L'Ϩ',(size_t *)&safe_width,
                 &max_height);
      max_lines = (wchar_t)_safe_width;
      if (max_lines + L'\x03' < tb._4_4_ + L'\xfffffffd') {
        local_1ac = max_lines + L'\x03';
      }
      else {
        local_1ac = tb._4_4_ + L'\xfffffffd';
      }
      local_1b0 = (wchar_t)max_height;
      if ((wchar_t)tb + L'\xffffffd8' <= local_1b0) {
        local_1b0 = (wchar_t)tb + L'\xffffffd8';
      }
      ch._8_4_ = -local_1b0;
      monster_list_format_textblock
                ((monster_list_t *)max_width,(textblock *)list,max_lines,local_1b0,(size_t *)0x0,
                 (size_t *)0x0);
      region_erase_bordered((region_conflict *)&ch.mods);
      if (ch.code == 0) {
        my_strcpy(local_188,"Press \'x\' to turn ON \'sort by exp\'",300);
      }
      else {
        my_strcpy(local_188,"Press \'x\' to turn OFF \'sort by exp\'",300);
      }
      orig_area.row = 1;
      orig_area.col = ch._8_4_;
      orig_area.width = local_1b0;
      orig_area.page_rows = local_1ac;
      kVar1 = textui_textblock_show((textblock *)list,orig_area,local_188);
      register0x00000000 = kVar1._0_8_;
      local_1a0 = CONCAT31(local_1a0._1_3_,kVar1.mods);
      ch.type = local_1a0;
      ch.code = (keycode_t)((ch.code != 0 ^ 0xffU) & 1);
      textblock_free((textblock *)list);
      monster_list_free((monster_list_t *)max_width);
    } while (iStack_54 == 0x78);
  }
  return;
}

Assistant:

void monster_list_show_interactive(int height, int width)
{
	textblock *tb;
	monster_list_t *list;
	size_t max_width = 0, max_height = 0;
	int safe_height, safe_width;
	region r;
	int sort_exp = 0;
	struct keypress ch;

	if (height < 1 || width < 1)
		return;

	// Repeat
	do {

		tb = textblock_new();
		list = monster_list_new();

		monster_list_collect(list);
		monster_list_get_glyphs(list);

		monster_list_sort(list, sort_exp ? monster_list_compare_exp : monster_list_standard_compare);

		/* Figure out optimal display rect. Large numbers are passed as the height
		 * and width limit so that we can calculate the maximum number of rows and
		 * columns to display the list nicely. We then adjust those values as
		 * needed to fit in the main term. Height is adjusted to account for the
		 * texblock prompt. The list is positioned on the right side of the term
		 * underneath the status line.
		 */
		monster_list_format_textblock(list, NULL, 1000, 1000, &max_height,
									  &max_width);
		safe_height = MIN(height - 3, (int) max_height + 3);
		safe_width = MIN(width - 40, (int) max_width);
		r.col = -safe_width;
		r.row = 1;
		r.width = safe_width;
		r.page_rows = safe_height;

		/*
		 * Actually draw the list. We pass in max_height to the format function so
		 * that all lines will be appended to the textblock. The textblock itself
		 * will handle fitting it into the region. However, we have to pass
		 * safe_width so that the format function will pad the lines properly so
		 * that the location string is aligned to the right edge of the list.
		 */
		monster_list_format_textblock(list, tb, (int) max_height, safe_width, NULL,
									  NULL);
		region_erase_bordered(&r);

		char buf[300];

		if (sort_exp) {
			my_strcpy(buf, "Press 'x' to turn OFF 'sort by exp'", sizeof(buf));
		}
		else {
			my_strcpy(buf, "Press 'x' to turn ON 'sort by exp'", sizeof(buf));
		}

		ch = textui_textblock_show(tb, r, buf);

		// Toggle sort
		sort_exp = !sort_exp;

		textblock_free(tb);
		monster_list_free(list);
	}
	while (ch.code == 'x');
}